

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

void __thiscall cmCustomCommandGenerator::FillEmulatorsWithArguments(cmCustomCommandGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  pointer pvVar3;
  bool bVar4;
  TargetType TVar5;
  cmake *cmakeInstance;
  cmListFileBacktrace *pcVar6;
  pointer pcVar7;
  cmGeneratorTarget *this_01;
  cmValue cVar8;
  string *psVar9;
  long lVar10;
  EmptyElements emptyElements;
  ulong uVar11;
  string_view value;
  string emulator;
  cmGeneratorExpression ge;
  string local_c8;
  undefined1 local_a8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string *local_50;
  cmGeneratorExpression local_48;
  
  this_00 = this->LG->Makefile;
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CMAKE_CROSSCOMPILING","");
  bVar4 = cmMakefile::IsOn(this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    cmakeInstance = cmLocalGenerator::GetCMakeInstance(this->LG);
    pcVar6 = cmCustomCommand::GetBacktrace(this->CC);
    local_80._M_allocated_capacity =
         (size_type)
         (pcVar6->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_80._8_8_ =
         (pcVar6->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_)->_M_use_count + 1;
      }
    }
    cmGeneratorExpression::cmGeneratorExpression
              (&local_48,cmakeInstance,(cmListFileBacktrace *)&local_80);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
    }
    pcVar7 = (this->CommandLines).
             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->CommandLines).
                            super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar7) >> 3) *
        -0x55555555 != 0) {
      local_50 = &this->CommandConfig;
      lVar10 = 0;
      uVar11 = 0;
      do {
        this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                            (this->LG,*(string **)
                                       ((long)&(pcVar7->
                                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ).
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       + lVar10));
        if (this_01 != (cmGeneratorTarget *)0x0) {
          TVar5 = cmGeneratorTarget::GetType(this_01);
          if (TVar5 == EXECUTABLE) {
            bVar4 = cmGeneratorTarget::IsImported(this_01);
            if (!bVar4) {
              local_c8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,"CROSSCOMPILING_EMULATOR","");
              cVar8 = cmGeneratorTarget::GetProperty(this_01,&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if (cVar8.Value != (string *)0x0) {
                local_70[0] = &local_60;
                pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_70,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
                cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a8,(string *)&local_48);
                local_a8._8_8_ = &local_90;
                local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_90._M_local_buf[0] = '\0';
                emptyElements = No;
                psVar9 = cmCompiledGeneratorExpression::Evaluate
                                   ((cmCompiledGeneratorExpression *)local_a8._0_8_,this->LG,
                                    local_50,(cmGeneratorTarget *)0x0,
                                    (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                                    (string *)(local_a8 + 8));
                pcVar2 = (psVar9->_M_dataplus)._M_p;
                local_c8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c8,pcVar2,pcVar2 + psVar9->_M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._8_8_ != &local_90) {
                  operator_delete((void *)local_a8._8_8_,
                                  CONCAT71(local_90._M_allocated_capacity._1_7_,
                                           local_90._M_local_buf[0]) + 1);
                }
                std::
                unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                               *)local_a8);
                if (local_70[0] != &local_60) {
                  operator_delete(local_70[0],local_60._M_allocated_capacity + 1);
                }
                pvVar3 = (this->EmulatorsWithArguments).
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                value._M_str = (char *)0x0;
                value._M_len = (size_t)local_c8._M_dataplus._M_p;
                cmList::insert((cmList *)
                               ((long)&(pvVar3->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data + lVar10),
                               *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 **)((long)&(pvVar3->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar10 + 8),
                               (const_iterator)local_c8._M_string_length,value,emptyElements);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
        }
        uVar11 = uVar11 + 1;
        pcVar7 = (this->CommandLines).
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x18;
      } while (uVar11 < (uint)((int)((ulong)((long)(this->CommandLines).
                                                                                                      
                                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                  .
                                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pcVar7) >> 3) * -0x55555555));
    }
    cmGeneratorExpression::~cmGeneratorExpression(&local_48);
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::FillEmulatorsWithArguments()
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return;
  }
  cmGeneratorExpression ge(*this->LG->GetCMakeInstance(),
                           this->CC->GetBacktrace());

  for (unsigned int c = 0; c < this->GetNumberOfCommands(); ++c) {
    // If the command is the plain name of an executable target,
    // launch it with its emulator.
    std::string const& argv0 = this->CommandLines[c][0];
    cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
    if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
        !target->IsImported()) {

      cmValue emulator_property =
        target->GetProperty("CROSSCOMPILING_EMULATOR");
      if (!emulator_property) {
        continue;
      }

      // Plain target names are replaced by GetArgv0Location with the
      // path to the executable artifact in the command config, so
      // evaluate the launcher's location in the command config too.
      std::string const emulator =
        ge.Parse(*emulator_property)->Evaluate(this->LG, this->CommandConfig);
      cmExpandList(emulator, this->EmulatorsWithArguments[c]);
    }
  }
}